

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceLayoutChanged
          (QSortFilterProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QObject *this_00;
  parameter_type pVar1;
  int iVar2;
  
  this_00 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  if (((sourceParents->d).size != 0) && ((this->saved_layoutChange_parents).d.size == 0)) {
    return;
  }
  qDeleteAll<QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*>>
            (&this->source_index_mapping);
  QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::clear
            (&this->source_index_mapping);
  update_persistent_indexes(this,&this->saved_persistent_indexes);
  QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::clear(&this->saved_persistent_indexes);
  pVar1 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
          ::value(&this->dynamic_sortfilter);
  if (pVar1) {
    iVar2 = find_source_sort_column(this);
    this->source_sort_column = iVar2;
  }
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)this_00,&this->saved_layoutChange_parents,NoLayoutChangeHint);
  QList<QPersistentModelIndex>::clear(&this->saved_layoutChange_parents);
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceLayoutChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QSortFilterProxyModel);
    Q_UNUSED(hint); // We can't forward Hint because we might filter additional rows or columns

    if (!sourceParents.isEmpty() && saved_layoutChange_parents.isEmpty())
        return;

    // Optimize: We only actually have to clear the mapping related to the contents of
    // sourceParents, not everything.
    qDeleteAll(source_index_mapping);
    source_index_mapping.clear();

    update_persistent_indexes(saved_persistent_indexes);
    saved_persistent_indexes.clear();

    if (dynamic_sortfilter)
        source_sort_column = find_source_sort_column();

    emit q->layoutChanged(saved_layoutChange_parents);
    saved_layoutChange_parents.clear();
}